

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extent.c
# Opt level: O3

extent_t *
extents_alloc(tsdn_t *tsdn,arena_t *arena,extent_hooks_t **r_extent_hooks,extents_t *extents,
             void *new_addr,size_t size,size_t pad,size_t alignment,_Bool slab,szind_t szind,
             _Bool *zero,_Bool *commit)

{
  pthread_mutex_t *__mutex;
  uint64_t *puVar1;
  witness_t **ppwVar2;
  nstime_t *pnVar3;
  ulong *puVar4;
  extent_t *size_00;
  byte *pbVar5;
  _Bool _Var6;
  int iVar7;
  uint uVar8;
  extent_split_interior_result_t eVar9;
  extent_hooks_t *peVar10;
  extents_t *peVar11;
  ulong uVar12;
  long lVar13;
  size_t sVar14;
  extents_t *peVar15;
  byte bVar16;
  byte bVar17;
  uint uVar18;
  rtree_ctx_t *extent;
  ulong uVar19;
  ulong uVar20;
  _Bool gdump;
  undefined1 extraout_DL;
  undefined1 uVar21;
  ulong uVar22;
  extent_t *extraout_RDX;
  extent_t *extent_00;
  extent_t *extraout_RDX_00;
  bitmap_t bVar23;
  extent_t *size_01;
  long lVar24;
  extent_t *peVar25;
  undefined1 growing_retained;
  extents_t **lead;
  rtree_ctx_t *ctx;
  void *pvVar26;
  bool bVar27;
  szind_t in_stack_fffffffffffffdd8;
  tsdn_t *tsdn_00;
  uint uStack_218;
  extent_t *peStack_1d8;
  extent_t *peStack_1d0;
  extents_t *peStack_1c8;
  extents_t *peStack_1c0;
  extents_t *peStack_1b8;
  rtree_ctx_t rStack_1b0;
  
  if (tsdn == (tsdn_t *)0x0) {
    ctx = &rStack_1b0;
    rtree_ctx_data_init(ctx);
  }
  else {
    ctx = &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
  }
  __mutex = (pthread_mutex_t *)((long)&(extents->mtx).field_0 + 0x40);
  iVar7 = pthread_mutex_trylock(__mutex);
  if (iVar7 != 0) {
    malloc_mutex_lock_slow(&extents->mtx);
    (extents->mtx).field_0.field_0.locked.repr = true;
  }
  puVar1 = &(extents->mtx).field_0.field_0.prof_data.n_lock_ops;
  *puVar1 = *puVar1 + 1;
  if ((extents->mtx).field_0.field_0.prof_data.prev_owner != tsdn) {
    (extents->mtx).field_0.field_0.prof_data.prev_owner = tsdn;
    ppwVar2 = &(extents->mtx).field_0.witness.link.qre_prev;
    *ppwVar2 = (witness_t *)((long)&(*ppwVar2)->name + 1);
  }
  if (*r_extent_hooks == (extent_hooks_t *)0x0) {
    peVar10 = base_extent_hooks_get(arena->base);
    *r_extent_hooks = peVar10;
  }
  size_00 = (extent_t *)(pad + size);
  if (new_addr == (void *)0x0) {
    uVar12 = alignment + 0xfff & 0xfffffffffffff000;
    size_01 = (extent_t *)((long)&size_00[-0x20].e_bits + uVar12);
    if (size_00 <= size_01) {
      sVar14 = extent_size_quantize_ceil((size_t)size_01);
      if (sVar14 < 0x7000000000000001) {
        uVar22 = sVar14 * 2 - 1;
        lVar13 = 0x3f;
        if (uVar22 != 0) {
          for (; uVar22 >> lVar13 == 0; lVar13 = lVar13 + -1) {
          }
        }
        uVar8 = (uint)lVar13;
        iVar7 = uVar8 - 0xe;
        if (uVar8 < 0xe) {
          iVar7 = 0;
        }
        bVar16 = 0xc;
        if (0xe < uVar8) {
          bVar16 = (char)lVar13 - 3;
        }
        uVar8 = ((uint)(((sVar14 - 1 >> (bVar16 & 0x3f)) << (bVar16 & 0x3f)) >> (bVar16 & 0x3f)) & 3
                ) + iVar7 * 4;
      }
      else {
        uVar8 = 199;
      }
      extent_00 = (extent_t *)
                  ((extents->bitmap[uVar8 >> 6] >> ((byte)uVar8 & 0x3f)) << ((byte)uVar8 & 0x3f));
      uVar19 = (ulong)(uVar8 & 0xffffffc0);
      uVar22 = (ulong)(uVar8 >> 6) - 1;
      peVar15 = (extents_t *)0x0;
LAB_0012b40b:
      if (extent_00 == (extent_t *)0x0) goto code_r0x0012b410;
      lVar13 = 0;
      if (extent_00 != (extent_t *)0x0) {
        for (; ((ulong)extent_00 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
        }
      }
      uVar19 = lVar13 + uVar19;
      if (uVar19 < 200) {
        peVar15 = (extents_t *)0x0;
        uVar22 = uVar19;
        do {
          peVar11 = (extents_t *)extent_heap_first(extents->heaps + uVar19);
          extent_00 = extraout_RDX_00;
          if ((extents->delay_coalesce != true) ||
             (extent_00 = (extent_t *)
                          (sz_pind2sz_tab[uVar22 & 0xffffffff] >>
                          ((byte)opt_lg_extent_max_active_fit & 0x3f)), extent_00 <= size_01)) {
            if (peVar15 != (extents_t *)0x0) {
              extent_00 = (extent_t *)((ulong)(peVar11->mtx).field_0.witness.name >> 0x2a);
              peVar25 = (extent_t *)((ulong)(peVar15->mtx).field_0.witness.name >> 0x2a);
              iVar7 = (uint)(peVar25 < extent_00) - (uint)(extent_00 < peVar25);
              if (iVar7 == 0) {
                extent_00 = (extent_t *)(peVar11->mtx).field_0.field_0.prof_data.max_wait_time.ns;
                peVar25 = (extent_t *)(peVar15->mtx).field_0.field_0.prof_data.max_wait_time.ns;
                iVar7 = (uint)(extent_00 >= peVar25 && extent_00 != peVar25) -
                        (uint)(extent_00 < peVar25);
              }
              if (-1 < iVar7) goto LAB_0012b4b8;
            }
            peVar15 = peVar11;
          }
LAB_0012b4b8:
          if (uVar19 == 199) goto LAB_0012b51f;
          uVar19 = uVar19 + 1;
          extent_00 = (extent_t *)
                      ((extents->bitmap[uVar19 >> 6] >> ((byte)uVar19 & 0x3f)) <<
                      ((byte)uVar19 & 0x3f));
          uVar22 = uVar19 & 0xffffffffffffffc0;
          uVar19 = (uVar19 >> 6) - 1;
          while (extent_00 == (extent_t *)0x0) {
            extent_00 = (extent_t *)extents->bitmap[uVar19 + 2];
            uVar22 = uVar22 + 0x40;
            uVar19 = uVar19 + 1;
            if (2 < uVar19) goto LAB_0012b51f;
          }
          lVar13 = 0;
          if (extent_00 != (extent_t *)0x0) {
            for (; ((ulong)extent_00 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
            }
          }
          uVar22 = lVar13 + uVar22;
          uVar19 = uVar22 & 0xffffffff;
          if (199 < uVar19) goto LAB_0012b51f;
        } while( true );
      }
      peVar15 = (extents_t *)0x0;
LAB_0012b51f:
      if ((alignment < 0x1001) || (peVar15 != (extents_t *)0x0)) goto LAB_0012b267;
      sVar14 = extent_size_quantize_ceil((size_t)size_00);
      if (sVar14 < 0x7000000000000001) {
        uVar22 = sVar14 * 2 - 1;
        lVar13 = 0x3f;
        if (uVar22 != 0) {
          for (; uVar22 >> lVar13 == 0; lVar13 = lVar13 + -1) {
          }
        }
        uVar8 = (uint)lVar13;
        iVar7 = uVar8 - 0xe;
        if (uVar8 < 0xe) {
          iVar7 = 0;
        }
        bVar16 = 0xc;
        if (0xe < uVar8) {
          bVar16 = (char)lVar13 - 3;
        }
        uVar8 = ((uint)(((sVar14 - 1 >> (bVar16 & 0x3f)) << (bVar16 & 0x3f)) >> (bVar16 & 0x3f)) & 3
                ) + iVar7 * 4;
      }
      else {
        uVar8 = 199;
      }
      sVar14 = extent_size_quantize_ceil((size_t)size_01);
      if (sVar14 < 0x7000000000000001) {
        uVar22 = sVar14 * 2 - 1;
        lVar13 = 0x3f;
        if (uVar22 != 0) {
          for (; uVar22 >> lVar13 == 0; lVar13 = lVar13 + -1) {
          }
        }
        uVar18 = (uint)lVar13;
        iVar7 = uVar18 - 0xe;
        if (uVar18 < 0xe) {
          iVar7 = 0;
        }
        bVar16 = 0xc;
        if (0xe < uVar18) {
          bVar16 = (char)lVar13 - 3;
        }
        uStack_218 = ((uint)(((sVar14 - 1 >> (bVar16 & 0x3f)) << (bVar16 & 0x3f)) >> (bVar16 & 0x3f)
                            ) & 3) + iVar7 * 4;
      }
      else {
        uStack_218 = 199;
      }
      bVar23 = (extents->bitmap[uVar8 >> 6] >> ((byte)uVar8 & 0x3f)) << ((byte)uVar8 & 0x3f);
      uVar19 = (ulong)(uVar8 & 0xffffffc0);
      uVar22 = (ulong)(uVar8 >> 6) - 1;
LAB_0012b5f1:
      if (bVar23 == 0) goto code_r0x0012b5f6;
      lVar13 = 0;
      if (bVar23 != 0) {
        for (; (bVar23 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
        }
      }
      uVar19 = lVar13 + uVar19;
      goto LAB_0012b619;
    }
  }
  else {
    peVar11 = (extents_t *)extent_lock_from_addr(tsdn,ctx,new_addr,false);
    if (peVar11 != (extents_t *)0x0) {
      if ((((arena_t *)arenas[(peVar11->mtx).field_0.lock_order & 0xfff].repr != arena) ||
          ((extent_t *)
           (((anon_union_8_2_694bb3b2_for_extent_s_2 *)&(peVar11->mtx).field_0.witness.comp)->
            e_size_esn & 0xfffffffffffff000) < size_00)) ||
         (peVar15 = peVar11,
         (*(ushort *)((long)&(peVar11->mtx).field_0 + 2) & extent_state_retained) != extents->state)
         ) {
        peVar15 = (extents_t *)0x0;
      }
      uVar22 = ((long)peVar11 * -0x775ed61580000000 |
               (ulong)((long)peVar11 * -0x783c846eeebdac2b) >> 0x21) * 0x4cf5ad432745937f ^
               0xd50dcc13;
      uVar12 = uVar22 + 0xd50dcc13;
      uVar22 = uVar22 + 0x1aa1b9826;
      uVar12 = (uVar12 >> 0x21 ^ uVar12) * -0xae502812aa7333;
      lVar24 = (uVar12 >> 0x21 ^ uVar12) * -0x3b314601e57a13ad;
      uVar12 = (uVar22 >> 0x21 ^ uVar22) * -0xae502812aa7333;
      lVar13 = (uVar12 >> 0x21 ^ uVar12) * -0x3b314601e57a13ad;
      uVar8 = ((uint)((ulong)lVar13 >> 0x21) ^ (uint)lVar13) +
              ((uint)((ulong)lVar24 >> 0x21) ^ (uint)lVar24) & 0xff;
      extent_mutex_pool.mutexes[uVar8].field_0.field_0.locked.repr = false;
      pthread_mutex_unlock
                ((pthread_mutex_t *)((long)&extent_mutex_pool.mutexes[uVar8].field_0 + 0x40));
      extent_00 = extraout_RDX;
LAB_0012b267:
      if (peVar15 != (extents_t *)0x0) {
LAB_0012b270:
        extents_remove_locked((tsdn_t *)extents,peVar15,extent_00);
        pbVar5 = (byte *)((long)&(peVar15->mtx).field_0.lock_order + 2);
        *pbVar5 = *pbVar5 & 0xfc;
        (extents->mtx).field_0.field_0.locked.repr = false;
        pthread_mutex_unlock(__mutex);
        lead = &peStack_1c0;
        extent = ctx;
        peStack_1b8 = peVar15;
        eVar9 = extent_split_interior
                          (tsdn,arena,r_extent_hooks,ctx,(extent_t **)&peStack_1b8,(extent_t **)lead
                           ,(extent_t **)&peStack_1c8,&peStack_1d0,&peStack_1d8,(void *)size,pad,
                           alignment,(ulong)slab,SUB41(szind,0),in_stack_fffffffffffffdd8,
                           SUB81(tsdn,0));
        uVar21 = (undefined1)in_stack_fffffffffffffdd8;
        growing_retained = SUB81(lead,0);
        if (eVar9 != extent_split_interior_ok) {
          uVar21 = gdump;
          if (peStack_1d8 != (extent_t *)0x0) {
            extent_deregister_impl(tsdn,peStack_1d8,gdump);
            uVar21 = extraout_DL;
          }
          if (peStack_1d0 == (extent_t *)0x0) {
            return (extent_t *)0x0;
          }
          extent_deregister_impl(tsdn,peStack_1d0,(_Bool)uVar21);
          extents_leak(tsdn,arena,r_extent_hooks,(extents_t *)(ulong)extents->state,peStack_1d0,
                       (_Bool)growing_retained);
          return (extent_t *)0x0;
        }
        if (peStack_1c0 != (extents_t *)0x0) {
          extent_deactivate(tsdn,(arena_t *)extents,peStack_1c0,(extent_t *)extent);
        }
        if (peStack_1c8 != (extents_t *)0x0) {
          extent_deactivate(tsdn,(arena_t *)extents,peStack_1c8,(extent_t *)extent);
        }
        peVar15 = peStack_1b8;
        if (peStack_1b8 == (extents_t *)0x0) {
          return (extent_t *)0x0;
        }
        uVar12 = (peStack_1b8->mtx).field_0.field_0.prof_data.tot_wait_time.ns;
        tsdn_00 = tsdn;
        if ((((uint)uVar12 >> 0xd & 1) == 0 & *commit) == 1) {
          uVar12 = (ulong)(peStack_1b8->mtx).field_0.witness.comp & 0xfffffffffffff000;
          _Var6 = extent_commit_impl(tsdn,arena,r_extent_hooks,(extent_t *)peStack_1b8,0,uVar12,
                                     (_Bool)uVar21);
          if (_Var6) {
            extent_record(tsdn,arena,r_extent_hooks,extents,(extent_t *)peVar15,SUB81(uVar12,0));
            return (extent_t *)0x0;
          }
          peVar10 = base_extent_hooks_get(arena->base);
          uVar12 = (peVar15->mtx).field_0.field_0.prof_data.tot_wait_time.ns;
          if ((peVar10 == &extent_hooks_default) && (opt_thp != thp_mode_always)) {
            uVar12 = uVar12 | 0x8000;
            (peVar15->mtx).field_0.field_0.prof_data.tot_wait_time.ns = uVar12;
          }
        }
        if (((uint)uVar12 >> 0xd & 1) != 0) {
          *commit = true;
        }
        if ((short)uVar12 < 0) {
          *zero = true;
        }
        if (alignment < 0x1000 && pad != 0) {
          uVar8 = (int)alignment + 0x3fU & 0x1fc0;
          lVar13 = 0x3f;
          if (uVar8 != 0) {
            for (; uVar8 >> lVar13 == 0; lVar13 = lVar13 + -1) {
            }
          }
          bVar16 = (byte)lVar13;
          if (tsdn_00 == (tsdn_t *)0x0) {
            pvVar26 = arenas[(uint)uVar12 & 0xfff].repr;
            uVar12 = *(ulong *)((long)pvVar26 + 0x2850);
            uVar22 = uVar12 * 0x5851f42d4c957f2d + 0x14057b7ef767814f;
            do {
              puVar4 = (ulong *)((long)pvVar26 + 0x2850);
              LOCK();
              bVar27 = uVar12 == *puVar4;
              if (bVar27) {
                *puVar4 = uVar22;
              }
              UNLOCK();
            } while (bVar27);
            bVar17 = -('\f' - bVar16);
          }
          else {
            uVar22 = (tsdn_00->tsd).
                     cant_access_tsd_items_directly_use_a_getter_or_setter_offset_state *
                     0x5851f42d4c957f2d + 0x14057b7ef767814f;
            (tsdn_00->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_offset_state =
                 uVar22;
            bVar17 = bVar16 + 0x34;
          }
          pnVar3 = &(peVar15->mtx).field_0.field_0.prof_data.max_wait_time;
          pnVar3->ns = pnVar3->ns + ((uVar22 >> (bVar17 & 0x3f)) << (bVar16 & 0x3f));
        }
        if (slab) {
          pbVar5 = (byte *)((long)&(peVar15->mtx).field_0.lock_order + 1);
          *pbVar5 = *pbVar5 | 0x10;
          extent_interior_register(tsdn_00,ctx,(extent_t *)peVar15,szind);
        }
        if (*zero == true) {
          if ((undefined1  [112])
              ((undefined1  [112])(peVar15->mtx).field_0 & (undefined1  [112])0x8000) !=
              (undefined1  [112])0x0) {
            return (extent_t *)peVar15;
          }
          pvVar26 = (void *)((peVar15->mtx).field_0.field_0.prof_data.max_wait_time.ns &
                            0xfffffffffffff000);
          uVar12 = (ulong)(peVar15->mtx).field_0.witness.comp & 0xfffffffffffff000;
          peVar10 = base_extent_hooks_get(arena->base);
          if (((peVar10 == &extent_hooks_default) && (opt_thp != thp_mode_always)) &&
             (_Var6 = pages_purge_forced(pvVar26,uVar12), !_Var6)) {
            return (extent_t *)peVar15;
          }
          memset(pvVar26,0,uVar12);
          return (extent_t *)peVar15;
        }
        return (extent_t *)peVar15;
      }
    }
  }
LAB_0012b373:
  (extents->mtx).field_0.field_0.locked.repr = false;
  pthread_mutex_unlock(__mutex);
  return (extent_t *)0x0;
code_r0x0012b410:
  extent_00 = (extent_t *)extents->bitmap[uVar22 + 2];
  uVar19 = uVar19 + 0x40;
  uVar22 = uVar22 + 1;
  if (2 < uVar22) goto LAB_0012b51f;
  goto LAB_0012b40b;
code_r0x0012b5f6:
  bVar23 = extents->bitmap[uVar22 + 2];
  uVar19 = uVar19 + 0x40;
  uVar22 = uVar22 + 1;
  if (2 < uVar22) goto code_r0x0012b60b;
  goto LAB_0012b5f1;
code_r0x0012b60b:
  uVar19 = 200;
LAB_0012b619:
  if (uStack_218 <= (uint)uVar19) goto LAB_0012b373;
LAB_0012b633:
  peVar15 = (extents_t *)extent_heap_first(extents->heaps + (uVar19 & 0xffffffff));
  uVar20 = (ulong)(peVar15->mtx).field_0.field_0.prof_data.max_wait_time.ns & 0xfffffffffffff000;
  uVar22 = (uVar12 - 1) + uVar20 & -uVar12;
  if (((uVar22 < uVar20) ||
      (uVar20 = (((anon_union_8_2_694bb3b2_for_extent_s_2 *)&(peVar15->mtx).field_0.witness.comp)->
                 e_size_esn & 0xfffffffffffff000) + uVar20, uVar20 <= uVar22)) ||
     (extent_00 = (extent_t *)(uVar20 - uVar22), extent_00 < size_00)) {
    uVar22 = (uVar19 & 0xffffffff) + 1;
    bVar23 = (extents->bitmap[uVar22 >> 6] >> ((byte)uVar22 & 0x3f)) << ((byte)uVar22 & 0x3f);
    uVar19 = uVar22 & 0xffffffffffffffc0;
    uVar22 = (uVar22 >> 6) - 1;
LAB_0012b6a1:
    if (bVar23 == 0) goto code_r0x0012b6a6;
    lVar13 = 0;
    if (bVar23 != 0) {
      for (; (bVar23 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
      }
    }
    uVar19 = lVar13 + uVar19;
    goto LAB_0012b6c9;
  }
  goto LAB_0012b270;
code_r0x0012b6a6:
  bVar23 = extents->bitmap[uVar22 + 2];
  uVar19 = uVar19 + 0x40;
  uVar22 = uVar22 + 1;
  if (2 < uVar22) goto code_r0x0012b6bb;
  goto LAB_0012b6a1;
code_r0x0012b6bb:
  uVar19 = 200;
LAB_0012b6c9:
  if (uStack_218 <= (uint)uVar19) goto LAB_0012b373;
  goto LAB_0012b633;
}

Assistant:

extent_t *
extents_alloc(tsdn_t *tsdn, arena_t *arena, extent_hooks_t **r_extent_hooks,
    extents_t *extents, void *new_addr, size_t size, size_t pad,
    size_t alignment, bool slab, szind_t szind, bool *zero, bool *commit) {
	assert(size + pad != 0);
	assert(alignment != 0);
	witness_assert_depth_to_rank(tsdn_witness_tsdp_get(tsdn),
	    WITNESS_RANK_CORE, 0);

	extent_t *extent = extent_recycle(tsdn, arena, r_extent_hooks, extents,
	    new_addr, size, pad, alignment, slab, szind, zero, commit, false);
	assert(extent == NULL || extent_dumpable_get(extent));
	return extent;
}